

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

precise_unit __thiscall units::precise_unit::operator*(precise_unit *this,precise_unit *other)

{
  precise_unit pVar1;
  
  pVar1.multiplier_ = this->multiplier_ * other->multiplier_;
  pVar1.base_units_ = detail::unit_data::operator*(&this->base_units_,&other->base_units_);
  pVar1.commodity_ = other->commodity_ | this->commodity_;
  return pVar1;
}

Assistant:

constexpr precise_unit operator*(const precise_unit& other) const
    {
        return {
            multiplier() * other.multiplier(),
            base_units_ * other.base_units_,
            (commodity_ == 0) ?
                other.commodity_ :
                ((other.commodity_ == 0) ? commodity_ :
                                           commodity_ | other.commodity_),
        };
    }